

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_2::PtexUtils::anon_unknown_1::reduceu<unsigned_char>
               (uchar *src,int sstride,int uw,int vw,uchar *dst,int dstride,int nchan)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  undefined1 *in_R8;
  int in_R9D;
  int in_stack_00000008;
  uchar *pixend;
  uchar *rowend;
  uchar *end;
  int drowskip;
  int srowskip;
  int rowlen;
  undefined1 *local_20;
  byte *local_8;
  
  iVar1 = in_EDX * in_stack_00000008;
  local_20 = in_R8;
  for (local_8 = in_RDI; local_8 != in_RDI + in_ECX * (in_ESI / 1);
      local_8 = local_8 + (in_ESI / 1 - iVar1)) {
    pbVar3 = local_8 + iVar1;
    for (; local_8 != pbVar3; local_8 = local_8 + in_stack_00000008) {
      pbVar4 = local_8 + in_stack_00000008;
      for (; local_8 != pbVar4; local_8 = local_8 + 1) {
        iVar2 = halve<int>((uint)*local_8 + (uint)local_8[in_stack_00000008]);
        *local_20 = (char)iVar2;
        local_20 = local_20 + 1;
      }
    }
    local_20 = local_20 + (in_R9D / 1 - iVar1 / 2);
  }
  return;
}

Assistant:

inline void reduceu(const T* src, int sstride, int uw, int vw,
                        T* dst, int dstride, int nchan)
    {
        sstride /= (int)sizeof(T);
        dstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int srowskip = sstride - rowlen;
        int drowskip = dstride - rowlen/2;
        for (const T* end = src + vw*sstride; src != end;
             src += srowskip, dst += drowskip)
            for (const T* rowend = src + rowlen; src != rowend; src += nchan)
                for (const T* pixend = src+nchan; src != pixend; src++)
                    *dst++ = T(halve(src[0] + src[nchan]));
    }